

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O3

uint8_t * __thiscall
icu_63::BMPSet::spanUTF8(BMPSet *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  char cVar1;
  int32_t lo;
  int32_t hi;
  uint uVar2;
  int32_t iVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  uint uVar12;
  
  pbVar10 = s + length;
  bVar5 = *s;
  if (-1 < (char)bVar5) {
    lVar4 = (long)length + -1;
    if (spanCondition == USET_SPAN_NOT_CONTAINED) {
      do {
        if (this->latin1Contains[bVar5] != '\0') {
          return s;
        }
        if (lVar4 == 0) {
          return pbVar10;
        }
        s = s + 1;
        bVar5 = *s;
        lVar4 = lVar4 + -1;
      } while (-1 < (char)bVar5);
    }
    else {
      do {
        if (this->latin1Contains[bVar5] == '\0') {
          return s;
        }
        if (lVar4 == 0) {
          return pbVar10;
        }
        s = s + 1;
        bVar5 = *s;
        lVar4 = lVar4 + -1;
      } while (-1 < (char)bVar5);
    }
    length = (int)pbVar10 - (int)s;
  }
  uVar12 = (uint)(spanCondition != USET_SPAN_NOT_CONTAINED);
  pbVar11 = pbVar10;
  if ((char)pbVar10[-1] < '\0') {
    if (pbVar10[-1] < 0xc0) {
      if (length < 2) goto LAB_00196e05;
      if (pbVar10[-2] < 0xe0) {
        if (((-0x41 < (char)pbVar10[-2]) || (length == 2)) || (pbVar10[-3] < 0xf0))
        goto LAB_00196e05;
        pbVar11 = pbVar10 + -3;
      }
      else {
        pbVar11 = pbVar10 + -2;
      }
    }
    else {
      pbVar11 = pbVar10 + -1;
    }
    if ((int)this->containsFFFD != uVar12) {
      pbVar10 = pbVar11;
    }
  }
LAB_00196e05:
  if (s < pbVar11) {
    cVar1 = this->containsFFFD;
    lo = this->list4kStarts[0x10];
    hi = this->list4kStarts[0x11];
    do {
      bVar5 = *s;
      pbVar7 = s;
      if (-1 < (char)bVar5) {
        pbVar7 = s + 1;
        if (spanCondition == USET_SPAN_NOT_CONTAINED) {
          do {
            if (this->latin1Contains[bVar5] != '\0') goto LAB_00197021;
            if (pbVar7 == pbVar11) {
              return pbVar10;
            }
            bVar5 = *pbVar7;
            pbVar7 = pbVar7 + 1;
          } while (-1 < (char)bVar5);
        }
        else {
          do {
            if (this->latin1Contains[bVar5] == '\0') {
LAB_00197021:
              return pbVar7 + -1;
            }
            if (pbVar7 == pbVar11) {
              return pbVar10;
            }
            bVar5 = *pbVar7;
            pbVar7 = pbVar7 + 1;
          } while (-1 < (char)bVar5);
        }
        pbVar7 = pbVar7 + -1;
      }
      s = pbVar7 + 1;
      if (bVar5 < 0xe0) {
        if ((bVar5 < 0xc0) || (0x3f < (byte)((ulong)*s ^ 0x80))) goto LAB_00196fae;
        if ((((byte)(this->table7FF[(ulong)*s ^ 0x80] >> (bVar5 & 0x1f)) ^
             spanCondition != USET_SPAN_NOT_CONTAINED) & 1) != 0) {
          return pbVar7;
        }
        s = pbVar7 + 2;
      }
      else {
        uVar9 = (ulong)*s ^ 0x80;
        if (bVar5 < 0xf0) {
          if (((byte)uVar9 < 0x40) && ((byte)(pbVar7[2] ^ 0x80) < 0x40)) {
            uVar2 = this->bmpBlockBits[uVar9] >> (bVar5 & 0xf) & 0x10001;
            if (uVar2 < 2) {
              if (uVar2 != uVar12) {
                return pbVar7;
              }
            }
            else {
              uVar2 = bVar5 & 0xf;
              iVar3 = findCodePoint(this,(int)uVar9 << 6 | uVar2 << 0xc | pbVar7[2] ^ 0x80,
                                    this->list4kStarts[uVar2],this->list4kStarts[(ulong)uVar2 + 1]);
              if ((((byte)iVar3 ^ spanCondition != USET_SPAN_NOT_CONTAINED) & 1) != 0) {
                return pbVar7;
              }
            }
            s = pbVar7 + 3;
          }
          else {
LAB_00196fae:
            if ((int)cVar1 != uVar12) {
              return pbVar7;
            }
          }
        }
        else {
          if (((0x3f < (byte)uVar9) || (0x3f < (byte)(pbVar7[2] ^ 0x80))) ||
             (0x3f < (byte)(pbVar7[3] ^ 0x80))) goto LAB_00196fae;
          iVar6 = (uint)bVar5 * 0x40000;
          iVar8 = (int)uVar9 * 0x1000;
          uVar2 = (int)cVar1;
          if (iVar6 + iVar8 + 0xfc3f0000U < 0x100000) {
            uVar2 = findCodePoint(this,(pbVar7[2] ^ 0x80) << 6 | pbVar7[3] ^ 0x80 |
                                       iVar6 + iVar8 + 0xfc400000U,lo,hi);
            uVar2 = uVar2 & 1;
          }
          if (uVar2 != uVar12) {
            return pbVar7;
          }
          s = pbVar7 + 4;
        }
      }
    } while (s < pbVar11);
  }
  return pbVar10;
}

Assistant:

const uint8_t *
BMPSet::spanUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    const uint8_t *limit=s+length;
    uint8_t b=*s;
    if(U8_IS_SINGLE(b)) {
        // Initial all-ASCII span.
        if(spanCondition) {
            do {
                if(!latin1Contains[b] || ++s==limit) {
                    return s;
                }
                b=*s;
            } while(U8_IS_SINGLE(b));
        } else {
            do {
                if(latin1Contains[b] || ++s==limit) {
                    return s;
                }
                b=*s;
            } while(U8_IS_SINGLE(b));
        }
        length=(int32_t)(limit-s);
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    const uint8_t *limit0=limit;

    /*
     * Make sure that the last 1/2/3/4-byte sequence before limit is complete
     * or runs into a lead byte.
     * In the span loop compare s with limit only once
     * per multi-byte character.
     *
     * Give a trailing illegal sequence the same value as the result of contains(FFFD),
     * including it if that is part of the span, otherwise set limit0 to before
     * the truncated sequence.
     */
    b=*(limit-1);
    if((int8_t)b<0) {
        // b>=0x80: lead or trail byte
        if(b<0xc0) {
            // single trail byte, check for preceding 3- or 4-byte lead byte
            if(length>=2 && (b=*(limit-2))>=0xe0) {
                limit-=2;
                if(containsFFFD!=spanCondition) {
                    limit0=limit;
                }
            } else if(b<0xc0 && b>=0x80 && length>=3 && (b=*(limit-3))>=0xf0) {
                // 4-byte lead byte with only two trail bytes
                limit-=3;
                if(containsFFFD!=spanCondition) {
                    limit0=limit;
                }
            }
        } else {
            // lead byte with no trail bytes
            --limit;
            if(containsFFFD!=spanCondition) {
                limit0=limit;
            }
        }
    }

    uint8_t t1, t2, t3;

    while(s<limit) {
        b=*s;
        if(U8_IS_SINGLE(b)) {
            // ASCII
            if(spanCondition) {
                do {
                    if(!latin1Contains[b]) {
                        return s;
                    } else if(++s==limit) {
                        return limit0;
                    }
                    b=*s;
                } while(U8_IS_SINGLE(b));
            } else {
                do {
                    if(latin1Contains[b]) {
                        return s;
                    } else if(++s==limit) {
                        return limit0;
                    }
                    b=*s;
                } while(U8_IS_SINGLE(b));
            }
        }
        ++s;  // Advance past the lead byte.
        if(b>=0xe0) {
            if(b<0xf0) {
                if( /* handle U+0000..U+FFFF inline */
                    (t1=(uint8_t)(s[0]-0x80)) <= 0x3f &&
                    (t2=(uint8_t)(s[1]-0x80)) <= 0x3f
                ) {
                    b&=0xf;
                    uint32_t twoBits=(bmpBlockBits[t1]>>b)&0x10001;
                    if(twoBits<=1) {
                        // All 64 code points with this lead byte and middle trail byte
                        // are either in the set or not.
                        if(twoBits!=(uint32_t)spanCondition) {
                            return s-1;
                        }
                    } else {
                        // Look up the code point in its 4k block of code points.
                        UChar32 c=(b<<12)|(t1<<6)|t2;
                        if(containsSlow(c, list4kStarts[b], list4kStarts[b+1]) != spanCondition) {
                            return s-1;
                        }
                    }
                    s+=2;
                    continue;
                }
            } else if( /* handle U+10000..U+10FFFF inline */
                (t1=(uint8_t)(s[0]-0x80)) <= 0x3f &&
                (t2=(uint8_t)(s[1]-0x80)) <= 0x3f &&
                (t3=(uint8_t)(s[2]-0x80)) <= 0x3f
            ) {
                // Give an illegal sequence the same value as the result of contains(FFFD).
                UChar32 c=((UChar32)(b-0xf0)<<18)|((UChar32)t1<<12)|(t2<<6)|t3;
                if( (   (0x10000<=c && c<=0x10ffff) ?
                            containsSlow(c, list4kStarts[0x10], list4kStarts[0x11]) :
                            containsFFFD
                    ) != spanCondition
                ) {
                    return s-1;
                }
                s+=3;
                continue;
            }
        } else {
            if( /* handle U+0000..U+07FF inline */
                b>=0xc0 &&
                (t1=(uint8_t)(*s-0x80)) <= 0x3f
            ) {
                if((USetSpanCondition)((table7FF[t1]&((uint32_t)1<<(b&0x1f)))!=0) != spanCondition) {
                    return s-1;
                }
                ++s;
                continue;
            }
        }

        // Give an illegal sequence the same value as the result of contains(FFFD).
        // Handle each byte of an illegal sequence separately to simplify the code;
        // no need to optimize error handling.
        if(containsFFFD!=spanCondition) {
            return s-1;
        }
    }

    return limit0;
}